

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ccallback.c
# Opt level: O0

void * lj_ccallback_new(CTState *cts,CType *ct,GCfunc *fn)

{
  MSize slot_00;
  CType *pCVar1;
  ulong uVar2;
  anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0 in_EDX;
  CType *in_RSI;
  CTState *in_RDI;
  GCtab *t;
  MSize slot;
  GCobj *o;
  TValue *local_90;
  CType *in_stack_ffffffffffffff78;
  CTState *in_stack_ffffffffffffff80;
  GCtab *t_00;
  undefined4 in_stack_ffffffffffffff88;
  void *local_58;
  
  pCVar1 = callback_checkfunc(in_RDI,in_RSI);
  if (pCVar1 == (CType *)0x0) {
    local_58 = (void *)0x0;
  }
  else {
    slot_00 = callback_slot_new(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    t_00 = in_RDI->miscmap;
    if (slot_00 < t_00->asize) {
      local_90 = (TValue *)((ulong)(t_00->array).ptr32 + (long)(int)slot_00 * 8);
    }
    else {
      local_90 = lj_tab_setinth((lua_State *)CONCAT44(slot_00,in_stack_ffffffffffffff88),t_00,
                                (int32_t)((ulong)in_RDI->L >> 0x20));
    }
    (local_90->field_2).field_0 = in_EDX;
    (local_90->field_2).it = 0xfffffff7;
    if ((t_00->marked & 4) != 0) {
      uVar2 = (ulong)(in_RDI->L->glref).ptr32;
      t_00->marked = t_00->marked & 0xfb;
      (t_00->gclist).gcptr32 = *(uint32_t *)(uVar2 + 0x3c);
      *(int *)(uVar2 + 0x3c) = (int)t_00;
    }
    local_58 = callback_slot2ptr(in_RDI,slot_00);
  }
  return local_58;
}

Assistant:

void *lj_ccallback_new(CTState *cts, CType *ct, GCfunc *fn)
{
  ct = callback_checkfunc(cts, ct);
  if (ct) {
    MSize slot = callback_slot_new(cts, ct);
    GCtab *t = cts->miscmap;
    setfuncV(cts->L, lj_tab_setint(cts->L, t, (int32_t)slot), fn);
    lj_gc_anybarriert(cts->L, t);
    return callback_slot2ptr(cts, slot);
  }
  return NULL;  /* Bad conversion. */
}